

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O1

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcWorkPlan,_0UL>::Construct
                   (DB *db,LIST *params)

{
  IfcWorkControl *this;
  
  this = (IfcWorkControl *)operator_new(0x228);
  *(undefined ***)&this->field_0x210 = &PTR__Object_00836880;
  *(undefined8 *)(this + 1) = 0;
  *(char **)&this[1].field_0x8 = "IfcWorkPlan";
  Assimp::IFC::Schema_2x3::IfcWorkControl::IfcWorkControl
            (this,&PTR_construction_vtable_24__008eb298);
  *(undefined ***)this = &PTR__IfcWorkPlan_008eb190;
  *(undefined ***)&this->field_0x210 = &PTR__IfcWorkPlan_008eb280;
  *(undefined ***)&this->field_0x88 = &PTR__IfcWorkPlan_008eb1b8;
  *(undefined ***)&this->field_0x98 = &PTR__IfcWorkPlan_008eb1e0;
  *(undefined ***)&this->field_0xd0 = &PTR__IfcWorkPlan_008eb208;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcWorkControl,_10UL>)._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcWorkPlan_008eb230;
  *(undefined ***)&this->field_0x200 = &PTR__IfcWorkPlan_008eb258;
  GenericFill<Assimp::IFC::Schema_2x3::IfcWorkPlan>(db,params,(IfcWorkPlan *)this);
  return (Object *)(&this->field_0x0 + *(long *)(*(long *)this + -0x18));
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }